

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[10],capnp::Text::Reader,kj::StringPtr&,char_const*>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [10],Reader *params_1,
          StringPtr *params_2,char **params_3)

{
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_38 = toCharSequence<char_const(&)[10]>((char (*) [10])this);
  local_48.ptr = *(char **)*params;
  local_48.size_ = *(long *)(*params + 8) - 1;
  local_58.ptr = (params_1->super_StringPtr).content.ptr;
  local_58.size_ = (params_1->super_StringPtr).content.size_ - 1;
  local_68 = toCharSequence<char_const*>((char **)params_2);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}